

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_AT_x86_int8
              (Mat *AT,Mat *A_int8_scales,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int M,
              int K,int transB,int output_transpose,float alpha,float beta,int constant_TILE_M,
              int constant_TILE_N,int constant_TILE_K,int nT,Option *opt)

{
  int *piVar1;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000040;
  long in_stack_00000048;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int i_1;
  float beta_1;
  float alpha_1;
  int output_transpose_1;
  int broadcast_type_C_1;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int ppi;
  gemm_x86_int8_omp_args args;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int i;
  Mat output_descales;
  float B_int8_scale;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_0000274c;
  int in_stack_00002750;
  int in_stack_00002754;
  Mat *in_stack_00002758;
  Mat *in_stack_00002760;
  Mat *in_stack_00002768;
  float *scale;
  int k_00;
  Mat *B_00;
  int j_00;
  Mat *BT_00;
  float in_stack_fffffffffffff4a4;
  float in_stack_fffffffffffff4a8;
  int in_stack_fffffffffffff4ac;
  Mat *in_stack_fffffffffffff4b0;
  void **ppvVar2;
  int in_stack_fffffffffffff4b8;
  int in_stack_fffffffffffff4bc;
  Mat *in_stack_fffffffffffff4c0;
  Mat *in_stack_fffffffffffff4c8;
  void **in_stack_fffffffffffff4e0;
  int in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4f0;
  int in_stack_fffffffffffff4f4;
  void **in_stack_fffffffffffff4f8;
  undefined8 in_stack_fffffffffffff500;
  int *in_stack_fffffffffffff510;
  int *in_stack_fffffffffffff518;
  int *in_stack_fffffffffffff520;
  int in_stack_fffffffffffff528;
  bool local_a79;
  bool local_a21;
  bool local_9f9;
  int local_9f8;
  int local_9f4;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined8 local_9e0;
  undefined4 local_9d8;
  long *local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined8 local_9b0;
  void *local_9a8;
  int *local_9a0;
  long local_998;
  undefined4 local_990;
  long *local_988;
  undefined4 local_980;
  int local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  long local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 local_950;
  undefined4 local_948;
  long *local_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined8 local_920;
  void *local_918;
  int *local_910;
  long local_908;
  undefined4 local_900;
  long *local_8f8;
  undefined4 local_8f0;
  int local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  long local_8d8;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  void *local_8b8;
  int *local_8b0;
  ulong local_8a8;
  undefined4 local_8a0;
  long *local_898;
  int local_890;
  int local_88c;
  int local_888;
  undefined4 local_884;
  undefined4 local_880;
  ulong local_878;
  int local_86c;
  int local_868;
  int local_864;
  undefined4 local_860;
  undefined4 local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  float local_848;
  int local_844;
  float local_840;
  int local_83c;
  int local_838;
  int local_834;
  undefined4 local_830;
  int local_82c;
  undefined4 local_828;
  undefined4 local_824;
  void *local_820;
  int *local_818;
  ulong local_810;
  undefined4 local_808;
  long *local_800;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  undefined4 local_7ec;
  int local_7e8;
  long local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined4 local_7c0;
  long *local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined8 local_798;
  void *local_790;
  int *local_788;
  long local_780;
  undefined4 local_778;
  long *local_770;
  undefined4 local_768;
  int local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  long local_750;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  void *local_720;
  int *local_718;
  undefined8 local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  int local_6e8;
  long local_6e0;
  float local_6d8;
  int local_6d4;
  undefined4 local_6d0;
  void *local_6c0;
  int *local_6b8;
  long local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  int local_694;
  int local_690;
  undefined4 local_68c;
  int local_688;
  long local_680;
  int local_678;
  int local_674;
  int local_670;
  undefined1 local_66c [8];
  float local_664;
  int local_660;
  undefined4 local_65c;
  undefined4 local_658;
  int local_654;
  long *local_638;
  long *local_630;
  int local_624;
  undefined8 *local_620;
  void **local_610;
  undefined8 *local_600;
  undefined8 *local_5f0;
  void **local_5e0;
  void **local_5d0;
  void **local_5c0;
  void **local_5b0;
  void **local_5a0;
  void **local_590;
  void **local_580;
  void **local_578;
  void **local_570;
  undefined1 local_565;
  int local_564;
  void **local_560;
  undefined8 *local_558;
  undefined1 local_545;
  int local_544;
  void **local_540;
  void **local_538;
  undefined1 local_525;
  int local_524;
  void **local_520;
  undefined8 *local_518;
  undefined4 local_508;
  int local_504;
  undefined8 *local_500;
  void **local_4f8;
  undefined4 local_4f0;
  int local_4ec;
  undefined8 *local_4e8;
  void **local_4e0;
  int local_498;
  undefined4 local_494;
  void **local_490;
  int local_478;
  undefined4 local_474;
  void **local_470;
  int local_458;
  undefined4 local_454;
  void **local_450;
  int local_438;
  undefined4 local_434;
  void **local_430;
  int local_418;
  undefined4 local_414;
  void **local_410;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  undefined8 *local_3d0;
  undefined8 *local_3b0;
  int local_398;
  undefined4 local_394;
  void **local_390;
  undefined8 *local_370;
  void **local_368;
  void **local_360;
  void **local_358;
  long local_350;
  void **local_348;
  long *local_340;
  undefined4 local_334;
  long local_330;
  void *local_328;
  undefined4 local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  long *local_308;
  undefined4 local_2fc;
  ulong local_2f8;
  void *local_2f0;
  undefined4 local_2e4;
  int local_2e0;
  int local_2dc;
  void **local_2d8;
  long *local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  void *local_2b8;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined4 local_274;
  long local_270;
  long *local_268;
  undefined4 local_25c;
  long local_258;
  void *local_250;
  undefined4 local_248;
  int local_244;
  void **local_240;
  long *local_238;
  undefined4 local_22c;
  long local_228;
  void *local_220;
  undefined4 local_218;
  int local_214;
  void **local_210;
  void *local_1f8;
  void *local_1c8;
  void *local_1b8;
  void *local_1a8;
  void *local_198;
  void *local_188;
  void *local_178;
  undefined1 local_14d;
  int local_14c;
  undefined8 *local_140;
  long *local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d0;
  int local_cc;
  undefined8 *local_c8;
  void **local_c0;
  long *local_b8;
  undefined4 local_ac;
  long local_a8;
  void *local_a0;
  undefined4 local_98;
  int local_94;
  void **local_90;
  undefined8 local_88;
  undefined8 local_80;
  int local_74;
  int local_70;
  int local_6c;
  void **local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_48;
  int local_44;
  void **local_40;
  undefined8 local_38;
  undefined8 local_30;
  void **local_20;
  long local_18;
  
  if (in_stack_00000018 == 0) {
    local_9f8 = *(int *)(in_RDX + 0x2c);
  }
  else {
    if (*(int *)(in_RDX + 0x28) == 3) {
      local_9f4 = *(int *)(in_RDX + 0x38);
    }
    else {
      local_9f4 = *(int *)(in_RDX + 0x30);
    }
    local_9f8 = local_9f4 * *(int *)(in_RDX + 0x18);
  }
  local_660 = local_9f8;
  scale = &local_664;
  B_00 = (Mat *)(local_66c + 4);
  BT_00 = (Mat *)local_66c;
  local_65c = in_XMM1_Da;
  local_658 = in_XMM0_Da;
  local_654 = in_R9D;
  local_638 = in_RSI;
  local_630 = in_RDI;
  get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffff500 >> 0x20),(int)in_stack_fffffffffffff500,
             (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(int)in_stack_fffffffffffff4f8,
             in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0,in_stack_fffffffffffff510,
             in_stack_fffffffffffff518,in_stack_fffffffffffff520,in_stack_fffffffffffff528);
  local_670 = (in_stack_00000008 + (int)local_664 + -1) / (int)local_664;
  local_674 = (local_660 + local_66c._4_4_ + -1) / (int)local_66c._4_4_;
  local_678 = (in_stack_00000010 + local_66c._0_4_ + -1) / (int)local_66c._0_4_;
  local_6c = local_66c._0_4_ * local_66c._4_4_;
  local_70 = (in_stack_00000010 + local_66c._0_4_ + -1) / (int)local_66c._0_4_;
  local_74 = (local_660 + local_66c._4_4_ + -1) / (int)local_66c._4_4_;
  local_88 = *(undefined8 *)(in_stack_00000048 + 0x10);
  local_68 = &local_6c0;
  local_80 = 1;
  local_6c0 = (void *)0x0;
  local_6b8 = (int *)0x0;
  local_6b0 = 0;
  local_6a8 = 0;
  local_6a0 = (long *)0x0;
  local_698 = 0;
  local_694 = 0;
  local_690 = 0;
  local_68c = 0;
  local_688 = 0;
  local_680 = 0;
  Mat::create(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8,
              (int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
              CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_00000040));
  local_570 = &local_6c0;
  if (local_6c0 != (void *)0x0) {
    local_368 = local_570;
  }
  local_9f9 = local_6c0 != (void *)0x0 && local_680 * local_688 != 0;
  if (local_9f9) {
    local_6d4 = local_674 * local_678;
    compute_B_int8_scale(B_00,scale);
    local_38 = *(undefined8 *)(in_stack_00000048 + 0x10);
    local_20 = &local_720;
    local_30 = 4;
    local_720 = (void *)0x0;
    local_718 = (int *)0x0;
    local_710 = 0;
    local_708 = 0;
    local_700 = (long *)0x0;
    local_6f8 = 0;
    local_6f4 = 0;
    local_6f0 = 0;
    local_6ec = 0;
    local_6e8 = 0;
    local_6e0 = 0;
    Mat::create(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4ac,
                CONCAT44(in_stack_fffffffffffff4a4,in_stack_00000040),(Allocator *)BT_00);
    local_578 = &local_720;
    if (local_720 != (void *)0x0) {
      local_360 = local_578;
    }
    local_a21 = local_720 != (void *)0x0 && local_6e0 * local_6e8 != 0;
    if (local_a21) {
      for (local_724 = 0; local_724 < in_stack_00000008; local_724 = local_724 + 1) {
        local_18 = (long)local_724;
        local_350 = (long)local_724;
        local_348 = &local_720;
        *(float *)((long)local_720 + local_350 * 4) =
             1.0 / (*(float *)(*local_638 + local_18 * 4) * local_6d8);
      }
      for (local_728 = 0; local_728 < local_6d4; local_728 = local_728 + 1) {
        local_72c = local_728 / local_678;
        local_730 = local_728 % local_678;
        local_734 = local_72c * local_66c._4_4_;
        local_738 = local_730 * local_66c._0_4_;
        local_740 = local_660 - local_734;
        piVar1 = std::min<int>(&local_740,(int *)(local_66c + 4));
        local_73c = *piVar1;
        local_748 = in_stack_00000010 - local_738;
        piVar1 = std::min<int>(&local_748,(int *)local_66c);
        local_744 = *piVar1;
        local_524 = local_734 / (int)local_66c._4_4_;
        local_518 = &local_7d8;
        local_520 = &local_6c0;
        local_328 = (void *)((long)local_6c0 + local_680 * local_524 * local_6b0);
        local_310 = &local_7d8;
        local_270 = (long)local_694 * (long)local_690 * local_6b0;
        local_4ec = local_738 / (int)local_66c._0_4_;
        local_4e0 = &local_790;
        local_4e8 = &local_7d8;
        local_250 = (void *)((long)local_328 + (long)local_694 * (long)local_4ec * local_6b0);
        local_240 = &local_790;
        local_750 = (long)local_694;
        local_620 = &local_7d8;
        local_758 = 1;
        local_75c = 1;
        local_760 = 1;
        local_764 = local_694;
        local_768 = 2;
        local_770 = local_6a0;
        local_778 = local_6a8;
        local_780 = local_6b0;
        local_788 = (int *)0x0;
        local_7b8 = local_6a0;
        local_244 = local_694;
        local_248 = 1;
        local_258 = local_6b0;
        local_25c = local_6a8;
        local_268 = local_6a0;
        local_274 = 0x10;
        local_314 = local_694;
        local_318 = local_690;
        local_31c = local_68c;
        local_330 = local_6b0;
        local_334 = local_6a8;
        local_340 = local_6a0;
        local_4f0 = 1;
        local_525 = 1;
        local_7d8 = 0;
        local_7c8 = 0;
        local_7c0 = 0;
        local_7b0 = 0;
        local_7ac = 0;
        local_7a8 = 0;
        local_7a4 = 0;
        local_7a0 = 0;
        local_798 = 0;
        local_7d0 = 0;
        k_00 = (int)((ulong)scale >> 0x20);
        j_00 = (int)((ulong)B_00 >> 0x20);
        local_370 = local_620;
        local_790 = local_250;
        if (in_stack_00000018 == 0) {
          transpose_pack_B_tile_quantize
                    ((Mat *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_00000040),BT_00,j_00,
                     (int)B_00,k_00,(int)scale,0.0);
        }
        else {
          pack_B_tile_quantize
                    ((Mat *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_00000040),BT_00,j_00,
                     (int)B_00,k_00,(int)scale,0.0);
        }
        local_610 = &local_790;
        local_390 = local_610;
        if (local_788 != (int *)0x0) {
          local_394 = 0xffffffff;
          LOCK();
          local_398 = *local_788;
          *local_788 = *local_788 + -1;
          UNLOCK();
          if (local_398 == 1) {
            if (local_770 == (long *)0x0) {
              local_1f8 = local_790;
              if (local_790 != (void *)0x0) {
                free(local_790);
              }
            }
            else {
              (**(code **)(*local_770 + 0x18))(local_770,local_790);
            }
          }
        }
        local_790 = (void *)0x0;
        local_780 = 0;
        local_778 = 0;
        local_768 = 0;
        local_764 = 0;
        local_760 = 0;
        local_75c = 0;
        local_758 = 0;
        local_750 = 0;
        local_788 = (int *)0x0;
      }
      local_44 = local_66c._4_4_ * (int)local_664;
      local_60 = *(undefined8 *)(in_stack_00000048 + 0x10);
      local_40 = &local_820;
      local_48 = 1;
      local_58 = 4;
      local_820 = (void *)0x0;
      local_818 = (int *)0x0;
      local_810 = 0;
      local_808 = 0;
      local_800 = (long *)0x0;
      local_7f8 = 0;
      local_7f4 = 0;
      local_7f0 = 0;
      local_7ec = 0;
      local_7e8 = 0;
      local_7e0 = 0;
      Mat::create(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8,
                  (int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                  CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_00000040));
      local_580 = &local_820;
      if (local_820 != (void *)0x0) {
        local_358 = local_580;
      }
      local_a79 = local_820 != (void *)0x0 && local_7e0 * local_7e8 != 0;
      if (local_a79) {
        local_840 = local_664;
        local_83c = local_66c._4_4_;
        local_838 = local_66c._0_4_;
        local_834 = local_654;
        local_830 = 0;
        local_82c = in_stack_00000020;
        local_828 = local_658;
        local_824 = local_65c;
        for (local_844 = 0; local_844 < local_670; local_844 = local_844 + 1) {
          local_848 = local_840;
          local_84c = local_83c;
          local_850 = local_838;
          local_854 = local_834;
          local_858 = local_82c;
          local_85c = local_828;
          local_860 = local_824;
          local_864 = local_844 * (int)local_840;
          local_86c = in_stack_00000008 - local_864;
          piVar1 = std::min<int>(&local_86c,(int *)&local_848);
          local_868 = *piVar1;
          local_544 = get_omp_thread_num();
          local_538 = &local_8b8;
          local_540 = &local_820;
          local_2f0 = (void *)((long)local_820 + local_7e0 * local_544 * local_810);
          local_2d8 = &local_8b8;
          local_8b0 = (int *)0x0;
          local_8a8 = local_810;
          local_8a0 = local_808;
          local_898 = local_800;
          local_88c = local_7f4;
          local_888 = local_7f0;
          local_884 = 1;
          local_880 = local_7ec;
          local_280 = (long)local_7f4 * (long)local_7f0 * local_810;
          local_878 = (local_280 + 0xfU & 0xfffffffffffffff0) / local_810;
          local_890 = local_7f8 + -1;
          if (local_7f8 == 4) {
            local_878 = (long)local_7f4 * (long)local_7f0;
          }
          local_284 = 0x10;
          local_2dc = local_7f4;
          local_2e0 = local_7f0;
          local_2e4 = local_7ec;
          local_2f8 = local_810;
          local_2fc = local_808;
          local_308 = local_800;
          local_545 = 1;
          local_8b8 = local_2f0;
          for (local_8bc = 0; local_8bc < local_660; local_8bc = local_84c + local_8bc) {
            local_8c4 = local_660 - local_8bc;
            piVar1 = std::min<int>(&local_8c4,&local_84c);
            local_8c0 = *piVar1;
            for (local_8c8 = 0; local_8c8 < in_stack_00000010; local_8c8 = local_850 + local_8c8) {
              local_8d0 = in_stack_00000010 - local_8c8;
              piVar1 = std::min<int>(&local_8d0,&local_850);
              local_8cc = *piVar1;
              local_14c = local_864 / (int)local_848;
              local_140 = &local_960;
              local_f4 = *(int *)((long)local_630 + 0x2c);
              local_f8 = (int)local_630[6];
              local_fc = *(undefined4 *)((long)local_630 + 0x34);
              local_108 = *local_630 + local_630[8] * (long)local_14c * local_630[2];
              local_110 = local_630[2];
              local_114 = (undefined4)local_630[3];
              local_120 = (long *)local_630[4];
              local_f0 = &local_960;
              local_e0 = (long)local_f4 * (long)local_f8 * local_110;
              local_cc = local_8c8 / local_850;
              local_c0 = &local_918;
              local_c8 = &local_960;
              local_a0 = (void *)(local_108 + (long)local_f4 * (long)local_cc * local_110);
              local_90 = &local_918;
              local_8d8 = (long)local_f4;
              local_600 = &local_960;
              local_564 = local_8bc / local_84c;
              local_558 = &local_9f0;
              local_560 = &local_6c0;
              local_2b8 = (void *)((long)local_6c0 + local_680 * local_564 * local_6b0);
              local_2a0 = &local_9f0;
              local_290 = (long)local_694 * (long)local_690 * local_6b0;
              local_504 = local_8c8 / local_850;
              local_4f8 = &local_9a8;
              local_500 = &local_9f0;
              local_220 = (void *)((long)local_2b8 + (long)local_694 * (long)local_504 * local_6b0);
              local_210 = &local_9a8;
              local_968 = (long)local_694;
              local_5f0 = &local_9f0;
              local_8e0 = 1;
              local_8e4 = 1;
              local_8e8 = 1;
              local_8f0 = 2;
              local_910 = (int *)0x0;
              local_928 = 0;
              local_92c = 0;
              local_930 = 0;
              local_934 = 0;
              local_948 = 0;
              local_950 = 0;
              local_958 = 0;
              local_960 = 0;
              local_970 = 1;
              local_974 = 1;
              local_978 = 1;
              local_97c = local_694;
              local_980 = 2;
              local_988 = local_6a0;
              local_990 = local_6a8;
              local_998 = local_6b0;
              local_9a0 = (int *)0x0;
              local_9d0 = local_6a0;
              local_98 = 1;
              local_d0 = 1;
              local_e4 = 0x10;
              local_14d = 1;
              local_214 = local_694;
              local_218 = 1;
              local_228 = local_6b0;
              local_22c = local_6a8;
              local_238 = local_6a0;
              local_294 = 0x10;
              local_2a4 = local_694;
              local_2a8 = local_690;
              local_2ac = local_68c;
              local_2c0 = local_6b0;
              local_2c4 = local_6a8;
              local_2d0 = local_6a0;
              local_508 = 1;
              local_565 = 1;
              local_920 = 0;
              local_938 = 0;
              local_9f0 = 0;
              local_9e0 = 0;
              local_9d8 = 0;
              local_9c8 = 0;
              local_9c4 = 0;
              local_9c0 = 0;
              local_9bc = 0;
              local_9b8 = 0;
              local_9b0 = 0;
              local_9e8 = 0;
              local_3d0 = local_5f0;
              local_3b0 = local_600;
              local_b8 = local_120;
              local_ac = local_114;
              local_a8 = local_110;
              local_94 = local_f4;
              local_9a8 = local_220;
              local_940 = local_120;
              local_918 = local_a0;
              local_908 = local_110;
              local_900 = local_114;
              local_8f8 = local_120;
              local_8ec = local_f4;
              gemm_transB_packed_tile_int8
                        (in_stack_00002768,in_stack_00002760,in_stack_00002758,in_stack_00002754,
                         in_stack_00002750,in_stack_0000274c,local_8c8,local_8cc,in_stack_00000040);
              ppvVar2 = &local_9a8;
              local_5e0 = ppvVar2;
              local_3f0 = ppvVar2;
              if (local_9a0 != (int *)0x0) {
                local_3f4 = 0xffffffff;
                LOCK();
                local_3f8 = *local_9a0;
                *local_9a0 = *local_9a0 + -1;
                UNLOCK();
                if (local_3f8 == 1) {
                  if (local_988 == (long *)0x0) {
                    local_1c8 = local_9a8;
                    if (local_9a8 != (void *)0x0) {
                      free(local_9a8);
                    }
                  }
                  else {
                    (**(code **)(*local_988 + 0x18))(local_988,local_9a8);
                  }
                }
              }
              *ppvVar2 = (void *)0x0;
              ppvVar2[2] = (void *)0x0;
              *(undefined4 *)(ppvVar2 + 3) = 0;
              *(undefined4 *)(ppvVar2 + 5) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
              *(undefined4 *)(ppvVar2 + 6) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
              *(undefined4 *)(ppvVar2 + 7) = 0;
              ppvVar2[8] = (void *)0x0;
              ppvVar2[1] = (void *)0x0;
              in_stack_fffffffffffff4f8 = &local_918;
              local_5d0 = in_stack_fffffffffffff4f8;
              local_410 = in_stack_fffffffffffff4f8;
              if (local_910 != (int *)0x0) {
                local_414 = 0xffffffff;
                LOCK();
                local_418 = *local_910;
                *local_910 = *local_910 + -1;
                UNLOCK();
                if (local_418 == 1) {
                  if (local_8f8 == (long *)0x0) {
                    local_1b8 = local_918;
                    if (local_918 != (void *)0x0) {
                      free(local_918);
                    }
                  }
                  else {
                    (**(code **)(*local_8f8 + 0x18))(local_8f8,local_918);
                  }
                }
              }
              *in_stack_fffffffffffff4f8 = (void *)0x0;
              in_stack_fffffffffffff4f8[2] = (void *)0x0;
              *(undefined4 *)(in_stack_fffffffffffff4f8 + 3) = 0;
              *(undefined4 *)(in_stack_fffffffffffff4f8 + 5) = 0;
              *(undefined4 *)((long)in_stack_fffffffffffff4f8 + 0x2c) = 0;
              *(undefined4 *)(in_stack_fffffffffffff4f8 + 6) = 0;
              *(undefined4 *)((long)in_stack_fffffffffffff4f8 + 0x34) = 0;
              *(undefined4 *)(in_stack_fffffffffffff4f8 + 7) = 0;
              in_stack_fffffffffffff4f8[8] = (void *)0x0;
              in_stack_fffffffffffff4f8[1] = (void *)0x0;
            }
            in_stack_00000040 = local_858;
            unpack_output_tile_dequantize
                      (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                       (Mat *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                       (int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                       (int)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4ac,
                       (int)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4e8,
                       (Mat *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                       in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a4,
                       (int)in_stack_fffffffffffff4f8);
          }
          in_stack_fffffffffffff4e0 = &local_8b8;
          local_5c0 = in_stack_fffffffffffff4e0;
          local_430 = in_stack_fffffffffffff4e0;
          if (local_8b0 != (int *)0x0) {
            local_434 = 0xffffffff;
            LOCK();
            local_438 = *local_8b0;
            *local_8b0 = *local_8b0 + -1;
            UNLOCK();
            if (local_438 == 1) {
              if (local_898 == (long *)0x0) {
                local_1a8 = local_8b8;
                if (local_8b8 != (void *)0x0) {
                  free(local_8b8);
                }
              }
              else {
                (**(code **)(*local_898 + 0x18))(local_898,local_8b8);
              }
            }
          }
          *in_stack_fffffffffffff4e0 = (void *)0x0;
          in_stack_fffffffffffff4e0[2] = (void *)0x0;
          *(undefined4 *)(in_stack_fffffffffffff4e0 + 3) = 0;
          *(undefined4 *)(in_stack_fffffffffffff4e0 + 5) = 0;
          *(undefined4 *)((long)in_stack_fffffffffffff4e0 + 0x2c) = 0;
          *(undefined4 *)(in_stack_fffffffffffff4e0 + 6) = 0;
          *(undefined4 *)((long)in_stack_fffffffffffff4e0 + 0x34) = 0;
          *(undefined4 *)(in_stack_fffffffffffff4e0 + 7) = 0;
          in_stack_fffffffffffff4e0[8] = (void *)0x0;
          in_stack_fffffffffffff4e0[1] = (void *)0x0;
        }
        local_624 = 0;
      }
      else {
        local_624 = -100;
      }
      local_6d0 = 1;
      local_5b0 = &local_820;
      local_450 = local_5b0;
      if (local_818 != (int *)0x0) {
        local_454 = 0xffffffff;
        LOCK();
        local_458 = *local_818;
        *local_818 = *local_818 + -1;
        UNLOCK();
        if (local_458 == 1) {
          if (local_800 == (long *)0x0) {
            local_198 = local_820;
            if (local_820 != (void *)0x0) {
              free(local_820);
            }
          }
          else {
            (**(code **)(*local_800 + 0x18))(local_800,local_820);
          }
        }
      }
      local_820 = (void *)0x0;
      local_810 = 0;
      local_808 = 0;
      local_7f8 = 0;
      local_7f4 = 0;
      local_7f0 = 0;
      local_7ec = 0;
      local_7e8 = 0;
      local_7e0 = 0;
      local_818 = (int *)0x0;
    }
    else {
      local_624 = -100;
      local_6d0 = 1;
    }
    ppvVar2 = &local_720;
    local_5a0 = ppvVar2;
    local_470 = ppvVar2;
    if (local_718 != (int *)0x0) {
      local_474 = 0xffffffff;
      LOCK();
      local_478 = *local_718;
      *local_718 = *local_718 + -1;
      UNLOCK();
      if (local_478 == 1) {
        if (local_700 == (long *)0x0) {
          local_188 = local_720;
          if (local_720 != (void *)0x0) {
            free(local_720);
          }
        }
        else {
          (**(code **)(*local_700 + 0x18))(local_700,local_720);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  else {
    local_624 = -100;
    local_6d0 = 1;
  }
  ppvVar2 = &local_6c0;
  if (local_6b8 != (int *)0x0) {
    local_494 = 0xffffffff;
    LOCK();
    local_498 = *local_6b8;
    *local_6b8 = *local_6b8 + -1;
    UNLOCK();
    if (local_498 == 1) {
      local_590 = ppvVar2;
      local_490 = ppvVar2;
      if (local_6a0 == (long *)0x0) {
        local_178 = local_6c0;
        if (local_6c0 != (void *)0x0) {
          free(local_6c0);
        }
      }
      else {
        (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_624;
}

Assistant:

static int gemm_AT_x86_int8(const Mat& AT, const Mat& A_int8_scales, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int K, int transB, int output_transpose, float alpha, float beta, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("gemm_AT_x86_int8");

    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // dynamic quantize B
    float B_int8_scale;
    compute_B_int8_scale(B, B_int8_scale);

    // NCNN_LOGE("%.4f %.4f", A_int8_scale, B_int8_scale);

    // const float output_descale = 1.f / (A_int8_scale * B_int8_scale);
    Mat output_descales(M, 4u, opt.workspace_allocator);
    if (output_descales.empty())
        return -100;

    for (int i = 0; i < M; i++)
    {
        output_descales[i] = 1.f / (A_int8_scales[i] * B_int8_scale);
    }

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
            pack_B_tile_quantize(B, BT_tile, j, max_jj, k, max_kk, B_int8_scale);
        else
            transpose_pack_B_tile_quantize(B, BT_tile, j, max_jj, k, max_kk, B_int8_scale);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    const struct gemm_x86_int8_omp_args args = {TILE_M, TILE_N, TILE_K, broadcast_type_C, 0, output_transpose, alpha, beta};

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        // shadowed variable for less openmp task args
        const int TILE_M = args.TILE_M;
        const int TILE_N = args.TILE_N;
        const int TILE_K = args.TILE_K;
        const int broadcast_type_C = args.broadcast_type_C;
        const int output_transpose = args.output_transpose;
        const float alpha = args.alpha;
        const float beta = args.beta;
        // const int output_elemtype = args.output_elemtype;

        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_dequantize(topT_tile, C, top_blob, broadcast_type_C, i, max_ii, j, max_jj, output_descales, alpha, beta, output_transpose);
        }
    }

    return 0;
}